

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void skewness_double_suite::test_left_skew(void)

{
  double *pdVar1;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  double local_80;
  moment_skewness<double> filter;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::basic_moment
            (&filter,0.125,0.25,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,1.0);
  local_80 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x266,"void skewness_double_suite::test_left_skew()",&stack0xffffffffffffff78,
             &local_80);
  local_80 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x267,"void skewness_double_suite::test_left_skew()",&stack0xffffffffffffff78,
             &local_80);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness(&filter);
  local_80 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x268,"void skewness_double_suite::test_left_skew()",&stack0xffffffffffffff78,
             &local_80);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,2.0);
  local_80 = 1.53333;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26a,0x10c8c1,&stack0xffffffffffffff78,&local_80,
             (double *)
             (-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.normalization) &
             (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                     super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                    filter.super_basic_moment<double,_(trial::online::with)2>.
                    super_basic_moment<double,_(trial::online::with)1>.normalization)),predicate);
  local_80 = 0.124444;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26b,0x10c8c1,&stack0xffffffffffffff78,&local_80,
             (double *)
             (-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.normalization
                      ) &
             (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                    filter.super_basic_moment<double,_(trial::online::with)2>.normalization)),
             predicate_00);
  pdVar1 = (double *)
           trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness(&filter);
  local_80 = 1.32288;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26c,0x10c8c1,&stack0xffffffffffffff78,&local_80,pdVar1,predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,5.0);
  local_80 = 2.84615;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.84615","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26e,0x10c8c1,&stack0xffffffffffffff78,&local_80,
             (double *)
             (-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.normalization) &
             (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                     super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                    filter.super_basic_moment<double,_(trial::online::with)2>.
                    super_basic_moment<double,_(trial::online::with)1>.normalization)),predicate_02)
  ;
  local_80 = 2.07671;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.07671","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26f,0x10c8c1,&stack0xffffffffffffff78,&local_80,
             (double *)
             (-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.normalization
                      ) &
             (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                    filter.super_basic_moment<double,_(trial::online::with)2>.normalization)),
             predicate_03);
  pdVar1 = (double *)
           trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness(&filter);
  local_80 = 1.45479;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.45479","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x270,0x10c8c1,&stack0xffffffffffffff78,&local_80,pdVar1,predicate_04);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,15.0);
  local_80 = 6.5174;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.5174","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x272,0x10c8c1,&stack0xffffffffffffff78,&local_80,
             (double *)
             (-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.normalization) &
             (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                     super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                    filter.super_basic_moment<double,_(trial::online::with)2>.
                    super_basic_moment<double,_(trial::online::with)1>.normalization)),predicate_05)
  ;
  local_80 = 27.632;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","27.632","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x273,0x10c8c1,&stack0xffffffffffffff78,&local_80,
             (double *)
             (-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.normalization
                      ) &
             (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                    filter.super_basic_moment<double,_(trial::online::with)2>.normalization)),
             predicate_06);
  pdVar1 = (double *)
           trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness(&filter);
  local_80 = 1.55579;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.55579","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x274,0x10c8c1,&stack0xffffffffffffff78,&local_80,pdVar1,predicate_07);
  return;
}

Assistant:

void test_left_skew()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_skewness<double> filter(one_over_eight, one_over_four, one_over_four);

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 2.84615, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.07671, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.45479, tolerance);
    filter.push(15.0);
    TRIAL_TEST_WITH(filter.mean(), 6.5174, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 27.632, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.55579, tolerance);
}